

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O2

void Handler_colorsetfile_ISSI_PlayerPawn
               (APlayerPawn *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  BYTE BVar1;
  int key;
  char *name;
  bool bVar2;
  FPlayerColorSet color;
  
  key = params[1].i;
  name = params[3].s;
  BVar1 = *(BYTE *)(params + 4);
  color.Name.Index = 0;
  FName::operator=(&color.Name,params[2].s);
  color.Lump = FWadCollection::CheckNumForName(&Wads,name);
  color.NumExtraRanges = '\0';
  color.RepresentativeColor = BVar1;
  if (key < 0) {
    FScriptPosition::Message(&bag->ScriptPosition,3,"Color set number must not be negative.\n");
  }
  else if (-1 < color.Lump) {
    bVar2 = DObject::IsKindOf((DObject *)info,PClassPlayerPawn::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assert_fail("info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef_properties.cpp"
                    ,0xa40,
                    "void Handler_colorsetfile_ISSI_PlayerPawn(APlayerPawn *, PClassActor *, Baggage &, FPropParam *)"
                   );
    }
    TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_>::Insert
              ((TMap<int,_FPlayerColorSet,_THashTraits<int>,_TValueTraits<FPlayerColorSet>_> *)
               &info[1].super_PClass.super_PNativeStruct.super_PStruct.Fields,key,&color);
  }
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(player, colorsetfile, ISSI, PlayerPawn)
{
	PROP_INT_PARM(setnum, 0);
	PROP_STRING_PARM(setname, 1);
	PROP_STRING_PARM(rangefile, 2);
	PROP_INT_PARM(representative_color, 3);

	FPlayerColorSet color;
	color.Name = setname;
	color.Lump = Wads.CheckNumForName(rangefile);
	color.RepresentativeColor = representative_color;
	color.NumExtraRanges = 0;

	if (setnum < 0)
	{
		bag.ScriptPosition.Message(MSG_OPTERROR, "Color set number must not be negative.\n");
	}
	else if (color.Lump >= 0)
	{
		assert(info->IsKindOf(RUNTIME_CLASS(PClassPlayerPawn)));
		static_cast<PClassPlayerPawn *>(info)->ColorSets.Insert(setnum, color);
	}
}